

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

RefNull * __thiscall wasm::Builder::makeRefNull(Builder *this,HeapType type)

{
  BasicHeapType id;
  RefNull *this_00;
  HeapType local_30;
  Type local_28;
  RefNull *local_20;
  RefNull *ret;
  Builder *this_local;
  HeapType type_local;
  
  ret = (RefNull *)this;
  this_local = (Builder *)type.id;
  this_00 = MixedArena::alloc<wasm::RefNull>(&this->wasm->allocator);
  local_20 = this_00;
  id = HeapType::getBottom((HeapType *)&this_local);
  HeapType::HeapType(&local_30,id);
  wasm::Type::Type(&local_28,local_30,Nullable);
  RefNull::finalize(this_00,local_28);
  return local_20;
}

Assistant:

RefNull* makeRefNull(HeapType type) {
    auto* ret = wasm.allocator.alloc<RefNull>();
    ret->finalize(Type(type.getBottom(), Nullable));
    return ret;
  }